

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

MemberSyntax * parseMember(string *text)

{
  StringRef capturedExpression;
  StringRef macroName;
  SourceManager *options;
  MemberSyntax *pMVar1;
  ExprLhs<slang::syntax::MemberSyntax_*&> expr;
  AssertionHandler catchAssertionHandler;
  MemberSyntax *member;
  Parser parser;
  Preprocessor preprocessor;
  SourceLineInfo *lineInfo;
  SmallVectorBase<slang::Diagnostic> *in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff768;
  SyntaxKind in_stack_fffffffffffff76c;
  Parser *in_stack_fffffffffffff770;
  char *in_stack_fffffffffffff778;
  AssertionHandler *this;
  Flags resultDisposition;
  undefined1 *preprocessor_00;
  Parser *this_00;
  SourceLineInfo local_828;
  Preprocessor *in_stack_fffffffffffff800;
  string_view in_stack_fffffffffffff808;
  string_view in_stack_fffffffffffff818;
  size_t local_3e8;
  Preprocessor *pPStack_3e0;
  BumpAllocator *local_3d8;
  Preprocessor *pPStack_3d0;
  Token *local_3c8;
  Token TStack_3c0;
  Token aTStack_3b0 [5];
  Bag *in_stack_fffffffffffffca8;
  pointer in_stack_fffffffffffffcb0;
  BumpAllocator *in_stack_fffffffffffffcb8;
  SourceManager *in_stack_fffffffffffffcc0;
  Preprocessor *in_stack_fffffffffffffcc8;
  span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>
  in_stack_fffffffffffffe40;
  
  preprocessor_00 = slang::diagnostics;
  slang::SmallVectorBase<slang::Diagnostic>::clear(in_stack_fffffffffffff760);
  options = getSourceManager();
  TStack_3c0.info = (Info *)0x0;
  aTStack_3b0[0].kind = Unknown;
  aTStack_3b0[0]._2_1_ = 0;
  aTStack_3b0[0].numFlags.raw = '\0';
  aTStack_3b0[0].rawLen = 0;
  local_3c8 = (Token *)0x0;
  TStack_3c0.kind = Unknown;
  TStack_3c0._2_1_ = 0;
  TStack_3c0.numFlags.raw = '\0';
  TStack_3c0.rawLen = 0;
  local_3d8 = (BumpAllocator *)0x0;
  pPStack_3d0 = (Preprocessor *)0x0;
  this_00 = (Parser *)&local_3d8;
  slang::Bag::Bag((Bag *)0x19e477);
  std::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>::span
            ((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> *)
             0x19e484);
  slang::parsing::Preprocessor::Preprocessor
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
             (Diagnostics *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             in_stack_fffffffffffffe40);
  slang::Bag::~Bag((Bag *)0x19e4c4);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPStack_3e0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff770,
             (char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
  slang::parsing::Preprocessor::pushSource
            (in_stack_fffffffffffff800,in_stack_fffffffffffff818,in_stack_fffffffffffff808);
  slang::Bag::Bag((Bag *)0x19e54c);
  slang::parsing::Parser::Parser(this_00,(Preprocessor *)preprocessor_00,(Bag *)options);
  resultDisposition = (Flags)options;
  slang::Bag::~Bag((Bag *)0x19e57a);
  pMVar1 = slang::parsing::Parser::parseSingleMember
                     (in_stack_fffffffffffff770,in_stack_fffffffffffff76c);
  local_828 = (SourceLineInfo)operator____catch_sr((char *)pPStack_3e0,local_3e8);
  this = (AssertionHandler *)&stack0xfffffffffffff7c8;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
             ,0x85);
  operator____catch_sr((char *)pPStack_3e0,local_3e8);
  lineInfo = (SourceLineInfo *)CONCAT44((int)(local_3e8 >> 0x20),1);
  macroName.m_size = (size_type)this;
  macroName.m_start = in_stack_fffffffffffff778;
  capturedExpression.m_start._4_4_ = in_stack_fffffffffffff76c;
  capturedExpression.m_start._0_4_ = in_stack_fffffffffffff768;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffff770;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)pPStack_3e0,macroName,lineInfo,capturedExpression,resultDisposition
            );
  expr = Catch::operator<=<slang::syntax::MemberSyntax_*&,_0>
                   ((Decomposer *)lineInfo,(MemberSyntax **)0x19e640);
  Catch::AssertionHandler::handleExpr<slang::syntax::MemberSyntax*&>
            (this,(ExprLhs<slang::syntax::MemberSyntax_*&> *)expr.m_lhs);
  Catch::AssertionHandler::complete((AssertionHandler *)pPStack_3e0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)pPStack_3e0);
  slang::parsing::Parser::~Parser((Parser *)pPStack_3e0);
  slang::parsing::Preprocessor::~Preprocessor(pPStack_3e0);
  return pMVar1;
}

Assistant:

const MemberSyntax& parseMember(const std::string& text) {
    diagnostics.clear();

    Preprocessor preprocessor(getSourceManager(), alloc, diagnostics);
    preprocessor.pushSource(text);

    Parser parser(preprocessor);
    MemberSyntax* member = parser.parseSingleMember(SyntaxKind::ModuleDeclaration);
    REQUIRE(member);
    return *member;
}